

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_shaderprogram.cpp
# Opt level: O1

void __thiscall
FShaderProgram::Compile
          (FShaderProgram *this,ShaderType type,char *name,FString *code,char *defines,
          int maxGlslVersion)

{
  ShaderType type_00;
  GLuint GVar1;
  FString patchedCode;
  GLint status;
  int lengths [1];
  GLsizei length;
  char *sources [1];
  undefined1 local_68 [8];
  FString local_60;
  int local_58;
  GLint local_54;
  char *local_50;
  char *local_48;
  GLint local_40;
  GLsizei local_3c;
  char *local_38;
  
  local_58 = maxGlslVersion;
  local_48 = defines;
  type_00 = (*_ptrc_glCreateShader)(type == Fragment ^ 0x8b31);
  this->mShaders[type] = type_00;
  local_50 = name;
  FString::FString((FString *)local_68,name);
  FGLDebug::LabelObject(0x82e1,type_00,(FString *)local_68);
  FString::~FString((FString *)local_68);
  PatchShader((FShaderProgram *)local_68,type_00,code,local_48,local_58);
  local_40 = *(GLint *)((long)local_68 + -0xc);
  local_38 = (char *)local_68;
  (*_ptrc_glShaderSource)(this->mShaders[type],1,&local_38,&local_40);
  (*_ptrc_glCompileShader)(this->mShaders[type]);
  local_54 = 0;
  (*_ptrc_glGetShaderiv)(this->mShaders[type],0x8b81,&local_54);
  if (local_54 == 0) {
    local_3c = 0;
    GetShaderInfoLog::buffer[0] = '\0';
    (*_ptrc_glGetShaderInfoLog)(this->mShaders[type],10000,&local_3c,GetShaderInfoLog::buffer);
    FString::FString(&local_60,GetShaderInfoLog::buffer);
    I_FatalError("Compile Shader \'%s\':\n%s\n",local_50,local_60.Chars);
    FString::~FString(&local_60);
  }
  else {
    if (this->mProgram == 0) {
      GVar1 = (*_ptrc_glCreateProgram)();
      this->mProgram = GVar1;
    }
    (*_ptrc_glAttachShader)(this->mProgram,this->mShaders[type]);
  }
  FString::~FString((FString *)local_68);
  return;
}

Assistant:

void FShaderProgram::Compile(ShaderType type, const char *name, const FString &code, const char *defines, int maxGlslVersion)
{
	CreateShader(type);

	const auto &handle = mShaders[type];

	FGLDebug::LabelObject(GL_SHADER, handle, name);

	FString patchedCode = PatchShader(type, code, defines, maxGlslVersion);
	int lengths[1] = { (int)patchedCode.Len() };
	const char *sources[1] = { patchedCode.GetChars() };
	glShaderSource(handle, 1, sources, lengths);

	glCompileShader(handle);

	GLint status = 0;
	glGetShaderiv(handle, GL_COMPILE_STATUS, &status);
	if (status == GL_FALSE)
	{
		I_FatalError("Compile Shader '%s':\n%s\n", name, GetShaderInfoLog(handle).GetChars());
	}
	else
	{
		if (mProgram == 0)
			mProgram = glCreateProgram();
		glAttachShader(mProgram, handle);
	}
}